

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_check_mandatory_subtree
              (lyd_node *tree,lyd_node *subtree,lyd_node *last_parent,lys_node *schema,int toplevel,
              int options)

{
  LYS_NODE LVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  lyd_node *local_88;
  lyd_node *local_80;
  lyd_node *local_70;
  int local_58;
  uint local_54;
  int ret;
  uint u;
  ly_set *present;
  lyd_node *iter;
  lys_node *siter_prev;
  lys_node *siter;
  int options_local;
  int toplevel_local;
  lys_node *schema_local;
  lyd_node *last_parent_local;
  lyd_node *subtree_local;
  lyd_node *tree_local;
  
  _ret = (ly_set *)0x0;
  local_58 = 1;
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcf,
                  "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                 );
  }
  if ((schema->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN
     ) {
    _ret = ly_set_new();
    if (_ret == (ly_set *)0x0) goto LAB_001854cf;
    if (((toplevel != 0) && (tree != (lyd_node *)0x0)) ||
       ((toplevel == 0 && (subtree != (lyd_node *)0x0)))) {
      if (toplevel == 0) {
        lyd_get_node_siblings(subtree->child,schema,_ret);
      }
      else {
        lyd_get_node_siblings(tree,schema,_ret);
      }
    }
  }
  LVar1 = schema->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    if ((_ret->number != 0) ||
       (lVar2._0_2_ = schema[1].flags, lVar2._2_1_ = schema[1].ext_size,
       lVar2._3_1_ = schema[1].iffeature_size, lVar2._4_1_ = schema[1].padding[0],
       lVar2._5_1_ = schema[1].padding[1], lVar2._6_1_ = schema[1].padding[2],
       lVar2._7_1_ = schema[1].padding[3], lVar2 == 0)) {
      for (siter_prev = schema->child; siter_prev != (lys_node *)0x0; siter_prev = siter_prev->next)
      {
        if (_ret->number == 0) {
          local_70 = (lyd_node *)0x0;
        }
        else {
          local_70 = *(_ret->set).d;
        }
        local_80 = last_parent;
        if (_ret->number != 0) {
          local_80 = *(_ret->set).d;
        }
        iVar3 = lyd_check_mandatory_subtree(tree,local_70,local_80,siter_prev,0,options);
        if (iVar3 != 0) goto LAB_001854cf;
      }
    }
    goto LAB_001854c8;
  }
  if (LVar1 == LYS_CHOICE) {
    present = (ly_set *)0x0;
    if (((toplevel != 0) && (tree != (lyd_node *)0x0)) ||
       ((toplevel == 0 && (subtree != (lyd_node *)0x0)))) {
      local_88 = tree;
      if (toplevel == 0) {
        local_88 = subtree->child;
      }
      for (present = (ly_set *)local_88; present != (ly_set *)0x0;
          present = (ly_set *)present[1].set.s) {
        siter_prev = lys_parent(*(lys_node **)present);
        iter = *(lyd_node **)present;
        while( true ) {
          bVar4 = false;
          if (siter_prev != (lys_node *)0x0) {
            bVar4 = (siter_prev->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
          }
          if ((!bVar4) || (siter_prev == schema)) break;
          iter = (lyd_node *)siter_prev;
          siter_prev = lys_parent(siter_prev);
        }
        if (siter_prev == schema) break;
      }
    }
    if (present == (ly_set *)0x0) {
      if (schema[1].dsc == (char *)0x0) {
        if ((schema->flags & 0x40) != 0) {
          ly_vlog(LYE_NOMANDCHOICE,LY_VLOG_LYD,last_parent,schema->name);
          goto LAB_001854cf;
        }
        goto LAB_001854c8;
      }
      iVar3 = lyd_check_mandatory_subtree
                        (tree,subtree,last_parent,(lys_node *)schema[1].dsc,toplevel,options);
    }
    else {
      if ((siter_prev == (lys_node *)0x0) || (iter == (lyd_node *)0x0)) {
        __assert_fail("siter && siter_prev",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,300,
                      "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                     );
      }
      iVar3 = lyd_check_mandatory_subtree
                        (tree,subtree,last_parent,(lys_node *)iter,toplevel,options);
    }
joined_r0x00185475:
    if (iVar3 != 0) goto LAB_001854cf;
  }
  else {
    if ((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) {
LAB_0018512d:
      iVar3 = lyd_check_mandatory_data(tree,last_parent,_ret,schema,options);
      goto joined_r0x00185475;
    }
    if (LVar1 == LYS_LIST) {
      iVar3 = lyd_check_mandatory_data(tree,last_parent,_ret,schema,options);
      if (iVar3 != 0) goto LAB_001854cf;
      for (local_54 = 0; local_54 < _ret->number; local_54 = local_54 + 1) {
        for (siter_prev = schema->child; siter_prev != (lys_node *)0x0;
            siter_prev = siter_prev->next) {
          iVar3 = lyd_check_mandatory_subtree
                            (tree,(lyd_node *)(_ret->set).s[local_54],
                             (lyd_node *)(_ret->set).s[local_54],siter_prev,0,options);
          if (iVar3 != 0) goto LAB_001854cf;
        }
      }
    }
    else {
      if (LVar1 == LYS_ANYXML) goto LAB_0018512d;
      if ((((LVar1 == LYS_CASE) || (LVar1 == LYS_NOTIF)) || (LVar1 == LYS_INPUT)) ||
         ((LVar1 == LYS_OUTPUT || (LVar1 == LYS_USES)))) {
        for (siter_prev = schema->child; siter_prev != (lys_node *)0x0;
            siter_prev = siter_prev->next) {
          iVar3 = lyd_check_mandatory_subtree(tree,subtree,last_parent,siter_prev,toplevel,options);
          if (iVar3 != 0) goto LAB_001854cf;
        }
      }
      else if (LVar1 == LYS_ANYDATA) goto LAB_0018512d;
    }
  }
LAB_001854c8:
  local_58 = 0;
LAB_001854cf:
  ly_set_free(_ret);
  return local_58;
}

Assistant:

static int
lyd_check_mandatory_subtree(struct lyd_node *tree, struct lyd_node *subtree, struct lyd_node *last_parent,
                            struct lys_node *schema, int toplevel, int options)
{
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    struct ly_set *present = NULL;
    unsigned int u;
    int ret = EXIT_FAILURE;

    assert(schema);

    if (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_CONTAINER)) {
        /* data node */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((toplevel && tree) || (!toplevel && subtree)) {
            if (toplevel) {
                lyd_get_node_siblings(tree, schema, present);
            } else {
                lyd_get_node_siblings(subtree->child, schema, present);
            }
        }
    }

    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }
        break;
    case LYS_LIST:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }

        /* go recursively */
        for (u = 0; u < present->number; u++) {
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->set.d[u], present->set.d[u], siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;

    case LYS_CONTAINER:
        if (present->number || !((struct lys_node_container *)schema)->presence) {
            /* if we have existing or non-presence container, go recursively */
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->number ? present->set.d[0] : NULL,
                                                present->number ? present->set.d[0] : last_parent,
                                                siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data tree from the choice */
        iter = NULL;
        if ((toplevel && tree) || (!toplevel && subtree)) {
            LY_TREE_FOR(toplevel ? tree : subtree->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_check_mandatory_subtree(tree, subtree, last_parent, ((struct lys_node_choice *)schema)->dflt,
                                                toplevel, options)) {
                    goto error;
                }
            } else if (schema->flags & LYS_MAND_TRUE) {
                /* choice requires some data to be instantiated */
                LOGVAL(LYE_NOMANDCHOICE, LY_VLOG_LYD, last_parent, schema->name);
                goto error;
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter_prev, toplevel, options)) {
                goto error;
            }
        }
        break;
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* go recursively */
        LY_TREE_FOR(schema->child, siter) {
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter, toplevel, options)) {
                goto error;
            }
        }
        break;
    default:
        /* stop */
        break;
    }

    ret = EXIT_SUCCESS;

error:
    ly_set_free(present);
    return ret;
}